

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrAsciiOperator,bool>
               (string_t *ldata,string_t *rdata,long *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  string_t needle;
  string_t needle_00;
  string_t haystack;
  string_t haystack_00;
  bool bVar1;
  long lVar2;
  undefined8 unaff_RBX;
  idx_t i_1;
  idx_t i;
  idx_t iVar3;
  idx_t row_idx;
  idx_t row_idx_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      haystack.value.pointer.ptr = (char *)unaff_RBX;
      haystack.value._0_8_ = lsel;
      needle.value.pointer.ptr = (char *)result_data;
      needle.value._0_8_ = rdata;
      lVar2 = InstrAsciiOperator::Operation<duckdb::string_t,duckdb::string_t,long>(haystack,needle)
      ;
      result_data[iVar3] = lVar2;
    }
  }
  else {
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      row_idx = iVar3;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)lsel->sel_vector[iVar3];
      }
      row_idx_00 = iVar3;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)rsel->sel_vector[iVar3];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00),
         bVar1)) {
        haystack_00.value.pointer.ptr = (char *)unaff_RBX;
        haystack_00.value._0_8_ = lsel;
        needle_00.value.pointer.ptr = (char *)result_data;
        needle_00.value._0_8_ = rdata;
        lVar2 = InstrAsciiOperator::Operation<duckdb::string_t,duckdb::string_t,long>
                          (haystack_00,needle_00);
        result_data[iVar3] = lVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,iVar3);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}